

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_optional.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::TestProto3OptionalMessage_NestedMessage::~TestProto3OptionalMessage_NestedMessage
          (TestProto3OptionalMessage_NestedMessage *this)

{
  TestProto3OptionalMessage_NestedMessage *this_local;
  
  ~TestProto3OptionalMessage_NestedMessage(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TestProto3OptionalMessage_NestedMessage::~TestProto3OptionalMessage_NestedMessage() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestProto3OptionalMessage.NestedMessage)
  SharedDtor(*this);
}